

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cc
# Opt level: O2

void phosg::expect_raises_fn<std::exception>(char *file,uint64_t line,function<void_()> *fn)

{
  ::std::function<void_()>::operator()(fn);
  expect_generic(false,"expected exception, but none raised",file,line);
  return;
}

Assistant:

void expect_raises_fn<std::exception>(const char* file, uint64_t line, std::function<void()> fn) {
  try {
    fn();
    expect_generic(false, "expected exception, but none raised", file, line);
  } catch (const std::exception& e) {
    return;
  } catch (...) {
    // TODO: It'd be nice to show SOMETHING about the thrown exception here,
    // but it's probably pretty rare to catch something that isn't a
    // std::exception anyway.
    expect_generic(false, "incorrect exception type raised", file, line);
  }
}